

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

nn_hash_item * nn_hash_get(nn_hash *self,uint32_t key)

{
  ulong uVar1;
  uint32_t uVar2;
  nn_list_item *it;
  nn_list_item *pnVar3;
  
  uVar2 = nn_hash_key(key);
  uVar1 = (ulong)uVar2 % (ulong)self->slots;
  it = nn_list_begin(self->array + uVar1);
  while( true ) {
    pnVar3 = nn_list_end(self->array + uVar1);
    if (it == pnVar3) {
      return (nn_hash_item *)0x0;
    }
    if (*(uint32_t *)&it[-1].prev == key) break;
    it = nn_list_next(self->array + uVar1,it);
  }
  return (nn_hash_item *)&it[-1].prev;
}

Assistant:

struct nn_hash_item *nn_hash_get (struct nn_hash *self, uint32_t key)
{
    uint32_t slot;
    struct nn_list_item *it;
    struct nn_hash_item *item;

    slot = nn_hash_key (key) % self->slots;

    for (it = nn_list_begin (&self->array [slot]);
          it != nn_list_end (&self->array [slot]);
          it = nn_list_next (&self->array [slot], it)) {
        item = nn_cont (it, struct nn_hash_item, list);
        if (item->key == key)
            return item;
    }

    return NULL;
}